

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oid.c
# Opt level: O2

int oid_subidentifier_encode_into(uchar **p,uchar *bound,uint value)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  bool bVar5;
  
  uVar1 = 0;
  uVar4 = value;
  do {
    uVar2 = uVar1;
    uVar1 = uVar2 + 1;
    bVar5 = 0x7f < uVar4;
    uVar4 = uVar4 >> 7;
  } while (bVar5);
  if (uVar2 < (ulong)((long)bound - (long)*p)) {
    (*p)[uVar2] = (byte)value & 0x7f;
    uVar3 = uVar1;
    while (bVar5 = uVar2 != 0, uVar2 = uVar2 - 1, bVar5) {
      value = value >> 7;
      (*p)[uVar3 - 2] = (byte)value | 0x80;
      uVar3 = uVar3 - 1;
    }
    *p = *p + uVar1;
    return 0;
  }
  return -0xb;
}

Assistant:

static int oid_subidentifier_encode_into(unsigned char **p,
                                         unsigned char *bound,
                                         unsigned int value)
{
    size_t num_bytes = oid_subidentifier_num_bytes(value);

    if ((size_t) (bound - *p) < num_bytes) {
        return MBEDTLS_ERR_OID_BUF_TOO_SMALL;
    }
    (*p)[num_bytes - 1] = (unsigned char) (value & 0x7f);
    value >>= 7;

    for (size_t i = 2; i <= num_bytes; i++) {
        (*p)[num_bytes - i] = 0x80 | (unsigned char) (value & 0x7f);
        value >>= 7;
    }
    *p += num_bytes;

    return 0;
}